

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AIMultiplayer.cpp
# Opt level: O0

void XPMP2::AIMultiInit(void)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  uint n;
  infoDataRefsTy drI;
  uint nDrM;
  multiDataRefsTy drM;
  char buf [100];
  value_type *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  value_type *in_stack_fffffffffffffc38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  allocator<char> *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  undefined1 local_329 [40];
  allocator<char> local_301;
  string local_300 [39];
  allocator<char> local_2d9;
  string local_2d8 [39];
  allocator<char> local_2b1;
  string local_2b0 [39];
  allocator<char> local_289;
  string local_288 [39];
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [39];
  allocator<char> local_1e9;
  string local_1e8 [55];
  allocator<char> local_1b1;
  string local_1b0 [36];
  uint local_18c;
  infoDataRefsTy local_188;
  uint local_134;
  multiDataRefsTy local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [3];
  
  drTcasOverride = XPLMFindDataRef("sim/operation/override/override_TCAS");
  drMapOverride = XPLMFindDataRef("sim/operation/override/override_multiplayer_map_layer");
  numSlots = 0;
  drTcasModeS = XPLMFindDataRef("sim/cockpit2/tcas/targets/modeS_id");
  bVar1 = GoTCASOverride();
  if (bVar1) {
    iVar2 = XPLMGetDatavi(drTcasModeS,0,0);
    if ((ulong)(long)iVar2 < 2) {
      drTcasModeS = 0;
      numSlots = 0;
    }
    else {
      numSlots = (long)iVar2 - 1;
      drTcasModeC = XPLMFindDataRef("sim/cockpit2/tcas/targets/modeC_code");
      drTcasFlightId = XPLMFindDataRef("sim/cockpit2/tcas/targets/flight_id");
      drTcasIcaoType = XPLMFindDataRef("sim/cockpit2/tcas/targets/icao_type");
      drTcasX = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/x");
      drTcasY = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/y");
      drTcasZ = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/z");
      drTcasVX = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vx");
      drTcasVY = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vy");
      drTcasVZ = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vz");
      drTcasVertSpeed = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vertical_speed");
      drTcasHeading = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/psi");
      drTcasPitch = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/the");
      drTcasRoll = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/phi");
      drTcasGrnd = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/weight_on_wheels");
      drTcasGear = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/gear_deploy");
      drTcasFlap = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/flap_ratio");
      drTcasFlap2 = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/flap_ratio2");
      drTcasSpeedbrake = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/speedbrake_ratio");
      drTcasSlat = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/slat_ratio");
      drTcasWingSweep = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/wing_sweep");
      drTcasThrottle = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/throttle");
      drTcasYokePitch = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_pitch");
      if (drTcasYokePitch == 0) {
        drTcasYokePitch = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_pitch");
      }
      drTcasYokeRoll = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_roll");
      if (drTcasYokeRoll == 0) {
        drTcasYokeRoll = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_roll");
      }
      drTcasYokeYaw = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_yaw");
      if (drTcasYokeYaw == 0) {
        drTcasYokeYaw = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_yaw");
      }
      drTcasLights = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/lights");
      drTcasWakeWingSpan = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wing_span_m");
      drTcasWakeWingArea = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wing_area_m2");
      drTcasWakeCat = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wake_cat");
      drTcasWakeMass = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/mass_kg");
      drTcasWakeAoA = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/aoa");
      drTcasWakeLift = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/lift_N");
    }
  }
  std::vector<XPMP2::multiDataRefsTy,_std::allocator<XPMP2::multiDataRefsTy>_>::clear
            ((vector<XPMP2::multiDataRefsTy,_std::allocator<XPMP2::multiDataRefsTy>_> *)0x322b10);
  multiDataRefsTy::multiDataRefsTy(&local_130);
  std::vector<XPMP2::multiDataRefsTy,_std::allocator<XPMP2::multiDataRefsTy>_>::push_back
            ((vector<XPMP2::multiDataRefsTy,_std::allocator<XPMP2::multiDataRefsTy>_> *)
             in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  local_134 = 1;
  while( true ) {
    multiDataRefsTy::clear(&local_130);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_x",(ulong)local_134);
    local_130.X = (XPLMDataRef)XPLMFindDataRef(local_68);
    if (local_130.X == (XPLMDataRef)0x0) break;
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_y",(ulong)local_134);
    local_130.Y = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_z",(ulong)local_134);
    local_130.Z = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_v_x",(ulong)local_134);
    local_130.v_x = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_v_y",(ulong)local_134);
    local_130.v_y = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_v_z",(ulong)local_134);
    local_130.v_z = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_the",(ulong)local_134);
    local_130.pitch = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_phi",(ulong)local_134);
    local_130.roll = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_psi",(ulong)local_134);
    local_130.heading = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_gear_deploy",(ulong)local_134);
    local_130.gear = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_flap_ratio",(ulong)local_134);
    local_130.flap = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_flap_ratio2",(ulong)local_134);
    local_130.flap2 = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_spoiler_ratio",(ulong)local_134)
    ;
    local_130.spoiler = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_speedbrake_ratio",
             (ulong)local_134);
    local_130.speedbrake = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_slat_ratio",(ulong)local_134);
    local_130.slat = (XPLMDataRef)XPLMFindDataRef(local_68);
    if (local_130.slat == (XPLMDataRef)0x0) {
      snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_sla1_ratio",(ulong)local_134);
      local_130.slat = (XPLMDataRef)XPLMFindDataRef(local_68);
    }
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_wing_sweep",(ulong)local_134);
    local_130.wingSweep = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_throttle",(ulong)local_134);
    local_130.throttle = (XPLMDataRef)XPLMFindDataRef(local_68);
    if (numSlots == 0) {
      snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_yolk_pitch",(ulong)local_134);
      local_130.yoke_pitch = (XPLMDataRef)XPLMFindDataRef(local_68);
      snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_yolk_roll",(ulong)local_134);
      local_130.yoke_roll = (XPLMDataRef)XPLMFindDataRef(local_68);
      snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_yolk_yaw",(ulong)local_134);
      local_130.yoke_yaw = (XPLMDataRef)XPLMFindDataRef(local_68);
    }
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_beacon_lights_on",
             (ulong)local_134);
    local_130.bcnLights = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_landing_lights_on",
             (ulong)local_134);
    local_130.landLights = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_nav_lights_on",(ulong)local_134)
    ;
    local_130.navLights = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_strobe_lights_on",
             (ulong)local_134);
    local_130.strbLights = (XPLMDataRef)XPLMFindDataRef(local_68);
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_taxi_light_on",(ulong)local_134)
    ;
    local_130.taxiLights = (XPLMDataRef)XPLMFindDataRef(local_68);
    bVar1 = multiDataRefsTy::operator_cast_to_bool(&local_130);
    if (!bVar1) break;
    std::vector<XPMP2::multiDataRefsTy,_std::allocator<XPMP2::multiDataRefsTy>_>::push_back
              ((vector<XPMP2::multiDataRefsTy,_std::allocator<XPMP2::multiDataRefsTy>_> *)
               in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    local_134 = local_134 + 1;
  }
  if (numSlots == 0) {
    sVar3 = std::vector<XPMP2::multiDataRefsTy,_std::allocator<XPMP2::multiDataRefsTy>_>::size
                      ((vector<XPMP2::multiDataRefsTy,_std::allocator<XPMP2::multiDataRefsTy>_> *)
                       gMultiRef);
    numSlots = sVar3 - 1;
  }
  std::vector<XPMP2::infoDataRefsTy,_std::allocator<XPMP2::infoDataRefsTy>_>::clear
            ((vector<XPMP2::infoDataRefsTy,_std::allocator<XPMP2::infoDataRefsTy>_> *)0x32317d);
  infoDataRefsTy::infoDataRefsTy(&local_188);
  std::vector<XPMP2::infoDataRefsTy,_std::allocator<XPMP2::infoDataRefsTy>_>::push_back
            ((vector<XPMP2::infoDataRefsTy,_std::allocator<XPMP2::infoDataRefsTy>_> *)
             in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
  for (local_18c = 1; local_18c <= numSlots; local_18c = local_18c + 1) {
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_tailnum",(ulong)local_18c);
    iVar2 = XPLMShareData(local_68,0x20,0);
    if (iVar2 == 0) {
      local_188.infoTailNum = (XPLMDataRef)0x0;
    }
    else {
      local_188.infoTailNum = (XPLMDataRef)XPLMFindDataRef();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                 (allocator<char> *)in_stack_fffffffffffffc60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
    }
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_ICAO",(ulong)local_18c);
    iVar2 = XPLMShareData(local_68,0x20,0);
    if (iVar2 == 0) {
      local_188.infoIcaoAcType = (XPLMDataRef)0x0;
    }
    else {
      local_188.infoIcaoAcType = (XPLMDataRef)XPLMFindDataRef();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                 (allocator<char> *)in_stack_fffffffffffffc60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
    }
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_manufacturer",(ulong)local_18c);
    iVar2 = XPLMShareData(local_68,0x20,0);
    if (iVar2 == 0) {
      local_188.infoManufacturer = (XPLMDataRef)0x0;
    }
    else {
      local_188.infoManufacturer = (XPLMDataRef)XPLMFindDataRef();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                 (allocator<char> *)in_stack_fffffffffffffc60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator(&local_211);
    }
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_model",(ulong)local_18c);
    iVar2 = XPLMShareData(local_68,0x20,0);
    if (iVar2 == 0) {
      local_188.infoModel = (XPLMDataRef)0x0;
    }
    else {
      local_188.infoModel = (XPLMDataRef)XPLMFindDataRef();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                 (allocator<char> *)in_stack_fffffffffffffc60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator(&local_239);
    }
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_ICAOairline",(ulong)local_18c);
    iVar2 = XPLMShareData(local_68,0x20,0);
    if (iVar2 == 0) {
      local_188.infoIcaoAirline = (XPLMDataRef)0x0;
    }
    else {
      local_188.infoIcaoAirline = (XPLMDataRef)XPLMFindDataRef();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                 (allocator<char> *)in_stack_fffffffffffffc60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::__cxx11::string::~string(local_260);
      std::allocator<char>::~allocator(&local_261);
    }
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_airline",(ulong)local_18c);
    iVar2 = XPLMShareData(local_68,0x20,0);
    if (iVar2 == 0) {
      local_188.infoAirline = (XPLMDataRef)0x0;
    }
    else {
      in_stack_fffffffffffffc70 = local_68;
      local_188.infoAirline = (XPLMDataRef)XPLMFindDataRef();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                 (allocator<char> *)in_stack_fffffffffffffc60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator(&local_289);
    }
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_flightnum",(ulong)local_18c);
    iVar2 = XPLMShareData(local_68,0x20,0);
    if (iVar2 == 0) {
      local_188.infoFlightNum = (XPLMDataRef)0x0;
    }
    else {
      in_stack_fffffffffffffc60 = local_68;
      local_188.infoFlightNum = (XPLMDataRef)XPLMFindDataRef();
      in_stack_fffffffffffffc68 = &local_2b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                 (allocator<char> *)in_stack_fffffffffffffc60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
    }
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_apt_from",(ulong)local_18c);
    iVar2 = XPLMShareData(local_68,0x20,0);
    if (iVar2 == 0) {
      local_188.infoAptFrom = (XPLMDataRef)0x0;
    }
    else {
      local_188.infoAptFrom = (XPLMDataRef)XPLMFindDataRef();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                 (allocator<char> *)in_stack_fffffffffffffc60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
    }
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_apt_to",(ulong)local_18c);
    iVar2 = XPLMShareData(local_68,0x20,0);
    if (iVar2 == 0) {
      local_188.infoAptTo = (XPLMDataRef)0x0;
    }
    else {
      in_stack_fffffffffffffc40 = local_68;
      local_188.infoAptTo = (XPLMDataRef)XPLMFindDataRef();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                 (allocator<char> *)in_stack_fffffffffffffc60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator(&local_301);
    }
    snprintf((char *)local_68,100,"sim/multiplayer/position/plane%u_cslModel",(ulong)local_18c);
    iVar2 = XPLMShareData(local_68,0x20,0);
    if (iVar2 == 0) {
      local_188.cslModel = (XPLMDataRef)0x0;
    }
    else {
      in_stack_fffffffffffffc30 = local_68;
      local_188.cslModel = (XPLMDataRef)XPLMFindDataRef();
      in_stack_fffffffffffffc38 = (value_type *)local_329;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                 (allocator<char> *)in_stack_fffffffffffffc60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::__cxx11::string::~string((string *)(local_329 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_329);
    }
    std::vector<XPMP2::infoDataRefsTy,_std::allocator<XPMP2::infoDataRefsTy>_>::push_back
              ((vector<XPMP2::infoDataRefsTy,_std::allocator<XPMP2::infoDataRefsTy>_> *)
               in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
  }
  return;
}

Assistant:

void AIMultiInit ()
{
    // *** TCAS Target dataRefs ***
    
    // Many of these will only be available with X-Plane 11.50b8 or later
    drTcasOverride      = XPLMFindDataRef("sim/operation/override/override_TCAS");
    drMapOverride       = XPLMFindDataRef("sim/operation/override/override_multiplayer_map_layer");

    // This is probably the most important one, serving as a key,
    // but for us also as an indicator if we are in the right XP version
    // to use TCAS Override
    numSlots = 0;
    drTcasModeS         = XPLMFindDataRef("sim/cockpit2/tcas/targets/modeS_id");
    if (GoTCASOverride())                   // we can use TCAS Override
    {
        // Let's establish array size (we shall not assume it is 64, though initially it is)
        numSlots = (size_t)XPLMGetDatavi(drTcasModeS, nullptr, 0, 0);
        if (numSlots >= 2) {                // expected is 64...just a safety check
            // Reduce by one: The user plane is off limits
            numSlots--;
            
            // Now fetch all the other dataRefs...they should work
            drTcasModeC         = XPLMFindDataRef("sim/cockpit2/tcas/targets/modeC_code");
            drTcasFlightId      = XPLMFindDataRef("sim/cockpit2/tcas/targets/flight_id");
            drTcasIcaoType      = XPLMFindDataRef("sim/cockpit2/tcas/targets/icao_type");
            drTcasX             = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/x");
            drTcasY             = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/y");
            drTcasZ             = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/z");
            drTcasVX            = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vx");
            drTcasVY            = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vy");
            drTcasVZ            = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vz");
            drTcasVertSpeed     = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vertical_speed");
            drTcasHeading       = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/psi");
            drTcasPitch         = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/the");
            drTcasRoll          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/phi");
            drTcasGrnd          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/weight_on_wheels");
            drTcasGear          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/gear_deploy");
            drTcasFlap          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/flap_ratio");
            drTcasFlap2         = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/flap_ratio2");
            drTcasSpeedbrake    = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/speedbrake_ratio");
            drTcasSlat          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/slat_ratio");
            drTcasWingSweep     = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/wing_sweep");
            drTcasThrottle      = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/throttle");
            drTcasYokePitch     = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_pitch");     // XP12 silently corrected the spelling
            if (!drTcasYokePitch)
                drTcasYokePitch = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_pitch");     // XP11 had copied the original spelling mistake
            drTcasYokeRoll      = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_roll");
            if (!drTcasYokeRoll)
                drTcasYokeRoll  = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_roll");
            drTcasYokeYaw       = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_yaw");
            if (!drTcasYokeYaw)
                drTcasYokeYaw   = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_yaw");
            drTcasLights        = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/lights");
            // Wake support as of XP12, so these can fail in earlier versions:
            drTcasWakeWingSpan  = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wing_span_m");
            drTcasWakeWingArea  = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wing_area_m2");
            drTcasWakeCat       = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wake_cat");
            drTcasWakeMass      = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/mass_kg");
            drTcasWakeAoA       = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/aoa");
            drTcasWakeLift      = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/lift_N");
        } else {
            // not expected to happen, but safety measure: fallback to classic TCAS
            drTcasModeS = nullptr;
            numSlots = 0;
        }
    }
    
    // *** Legacy Multiplayer DataRefs ***
    
    // We need them only for proper initialization at the beginning
    // and when not filling all (19) slots
    char        buf[100];
    gMultiRef.clear();                      // just a safety measure against multi init
    multiDataRefsTy drM;                    // one set of dataRefs for one plane
    gMultiRef.push_back(drM);               // add an empty record at position 0 (user's plane)

    // Code for finding a standard X-Plane dataRef
#define FIND_PLANE_DR(membVar, dataRefTxt, PlaneNr)                         \
    snprintf(buf,sizeof(buf),"sim/multiplayer/position/plane%u_" dataRefTxt,PlaneNr);    \
    drM.membVar = XPLMFindDataRef(buf);

    // We don't know how many multiplayer planes there are - fetch as many as we can.
    // Loop over all possible AI/multiplayer slots
    for (unsigned nDrM = 1; true; nDrM++)
    {
        drM.clear();
        // position
        FIND_PLANE_DR(X,                    "x",                    nDrM);
        if (!drM.X) break;
        FIND_PLANE_DR(Y,                    "y",                    nDrM);
        FIND_PLANE_DR(Z,                    "z",                    nDrM);
        // cartesian velocities
        FIND_PLANE_DR(v_x,                  "v_x",                  nDrM);
        FIND_PLANE_DR(v_y,                  "v_y",                  nDrM);
        FIND_PLANE_DR(v_z,                  "v_z",                  nDrM);
        // attitude
        FIND_PLANE_DR(pitch,                "the",                  nDrM);
        FIND_PLANE_DR(roll,                 "phi",                  nDrM);
        FIND_PLANE_DR(heading,              "psi",                  nDrM);
        // configuration
        FIND_PLANE_DR(gear,                 "gear_deploy",          nDrM);
        FIND_PLANE_DR(flap,                 "flap_ratio",           nDrM);
        FIND_PLANE_DR(flap2,                "flap_ratio2",          nDrM);
        FIND_PLANE_DR(spoiler,              "spoiler_ratio",        nDrM);
        FIND_PLANE_DR(speedbrake,           "speedbrake_ratio",     nDrM);
        FIND_PLANE_DR(slat,                 "slat_ratio",           nDrM); // _should_ expect this name
        if (!drM.slat) {
            FIND_PLANE_DR(slat,             "sla1_ratio",           nDrM); // but in reality it is this
        }
        FIND_PLANE_DR(wingSweep,            "wing_sweep",           nDrM);
        FIND_PLANE_DR(throttle,             "throttle",             nDrM);
        
        // In XP12 the following classic dataRefs are considered legacy and throw user-visible warnings if used
        // I'm too lazy to use the (proper) array sim/multiplayer/controls/yoke_pitch_ratio[20] instead
        // due to that being an array dataRefs as opposed to these here using plane%u semantics.
        // But in XP12 we don't need the legacy dataRefs anyway, so we can live without these 3 if we have TCAS override:
        if (!numSlots) {
            FIND_PLANE_DR(yoke_pitch,       "yolk_pitch",           nDrM);
            FIND_PLANE_DR(yoke_roll,        "yolk_roll",            nDrM);
            FIND_PLANE_DR(yoke_yaw,         "yolk_yaw",             nDrM);
        }
        
        // lights
        FIND_PLANE_DR(bcnLights,            "beacon_lights_on",     nDrM);
        FIND_PLANE_DR(landLights,           "landing_lights_on",    nDrM);
        FIND_PLANE_DR(navLights,            "nav_lights_on",        nDrM);
        FIND_PLANE_DR(strbLights,           "strobe_lights_on",     nDrM);
        FIND_PLANE_DR(taxiLights,           "taxi_light_on",        nDrM);
        if (!drM) break;                    // break out of loop once the slot doesn't exist
        gMultiRef.push_back(drM);
    }
    
    // If using TCAS fallback with multiplayer dataRefs
    // then we set the number of slots based on available multiplayer slots
    if (!numSlots)
        numSlots = gMultiRef.size()-1;
    
    // *** Shared dataRefs for providing additional text info ***
    
    // While these had been defined to be 19 only,
    // we extend it to as many as there are TCAS targets
    gInfoRef.clear();
    infoDataRefsTy  drI;            // one set of dataRefs for one plane
    gInfoRef.push_back(drI);        // add an empty record at position 0 (user's plane)

    // Code for finding a non-standard shared dataRef for text information sharing
#define SHARE_PLANE_DR(membVar, dataRefTxt, PlaneNr)                                    \
    snprintf(buf,sizeof(buf),"sim/multiplayer/position/plane%u_" dataRefTxt,PlaneNr);   \
    if (XPLMShareData(buf, xplmType_Data, NULL, NULL)) {                                \
        drI.membVar = XPLMFindDataRef(buf);                                             \
        vecDREdataRefStr.push_back(buf);                                                \
    }                                                                                   \
    else drI.membVar = NULL;
    
    // We add as many shared info dataRefs as there are TCAS targets (probably 63)
    // or alternatively standard multiplayer dataRefs
    for (unsigned n = 1; n <= numSlots; n++)
    {
        // Shared data for providing textual info (see XPMPInfoTexts_t)
        SHARE_PLANE_DR(infoTailNum,         "tailnum",              n);
        SHARE_PLANE_DR(infoIcaoAcType,      "ICAO",                 n);
        SHARE_PLANE_DR(infoManufacturer,    "manufacturer",         n);
        SHARE_PLANE_DR(infoModel,           "model",                n);
        SHARE_PLANE_DR(infoIcaoAirline,     "ICAOairline",          n);
        SHARE_PLANE_DR(infoAirline,         "airline",              n);
        SHARE_PLANE_DR(infoFlightNum,       "flightnum",            n);
        SHARE_PLANE_DR(infoAptFrom,         "apt_from",             n);
        SHARE_PLANE_DR(infoAptTo,           "apt_to",               n);
        SHARE_PLANE_DR(cslModel,            "cslModel",             n);
        gInfoRef.push_back(drI);
    }
}